

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cache.c
# Opt level: O3

void mbedtls_ssl_cache_free(mbedtls_ssl_cache_context *cache)

{
  mbedtls_ssl_cache_entry *pmVar1;
  mbedtls_ssl_cache_entry *__ptr;
  
  __ptr = cache->chain;
  while (__ptr != (mbedtls_ssl_cache_entry *)0x0) {
    pmVar1 = __ptr->next;
    mbedtls_ssl_session_free(&__ptr->session);
    free((__ptr->peer_cert).p);
    free(__ptr);
    __ptr = pmVar1;
  }
  cache->chain = (mbedtls_ssl_cache_entry *)0x0;
  return;
}

Assistant:

void mbedtls_ssl_cache_free( mbedtls_ssl_cache_context *cache )
{
    mbedtls_ssl_cache_entry *cur, *prv;

    cur = cache->chain;

    while( cur != NULL )
    {
        prv = cur;
        cur = cur->next;

        mbedtls_ssl_session_free( &prv->session );

#if defined(MBEDTLS_X509_CRT_PARSE_C)
        mbedtls_free( prv->peer_cert.p );
#endif /* MBEDTLS_X509_CRT_PARSE_C */

        mbedtls_free( prv );
    }

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_free( &cache->mutex );
#endif
    cache->chain = NULL;
}